

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setsout.c
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  long lVar2;
  char *__s;
  
  if (argc < 3) {
    __s = "setsysout version sysout-name";
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtol(argv[1],(char **)0x0,10);
    if (0 < (int)lVar2 && *piVar1 == 0) {
      set_sysout((int)lVar2,argv[2]);
      exit(0);
    }
    __s = "version must be an integer > 0.";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char **argv) {
  int version;
  if (argc < 3) {
    printf("setsysout version sysout-name\n");
    return (-1);
  }
  errno = 0;
  version = (int)strtol(argv[1], (char **)NULL, 10);
  if (errno || version <= 0) {
    printf("version must be an integer > 0.\n");
    return (-1);
  }
  set_sysout(version, argv[2]);
  exit(0);
}